

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void __thiscall sf::priv::RenderTextureImplFBO::RenderTextureImplFBO(RenderTextureImplFBO *this)

{
  undefined8 *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_bool>
  pVar1;
  Lock lock;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  RenderTextureImpl *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  Lock *in_stack_ffffffffffffff90;
  value_type *__x;
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  *this_00;
  
  RenderTextureImpl::RenderTextureImpl(in_stack_ffffffffffffff80);
  GlResource::GlResource((GlResource *)0x17030b);
  *in_RDI = &PTR__RenderTextureImplFBO_001d7898;
  __x = (value_type *)(in_RDI + 1);
  std::
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::map((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         *)0x17032a);
  this_00 = (set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
             *)(in_RDI + 7);
  std::
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::map((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         *)0x17033d);
  *(undefined4 *)(in_RDI + 0xd) = 0;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  in_RDI[0xf] = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  *(undefined1 *)((long)in_RDI + 0x85) = 0;
  Lock::Lock(in_stack_ffffffffffffff90,
             (Mutex *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  GlResource::registerContextDestroyCallback
            ((ContextDestroyCallback)in_stack_ffffffffffffff80,
             (void *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  ::insert(this_00,__x);
  pVar1 = std::
          set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
          ::insert(this_00,__x);
  Lock::~Lock((Lock *)pVar1.first._M_node._M_node);
  return;
}

Assistant:

RenderTextureImplFBO::RenderTextureImplFBO() :
m_depthStencilBuffer(0),
m_colorBuffer       (0),
m_width             (0),
m_height            (0),
m_context           (NULL),
m_textureId         (0),
m_multisample       (false),
m_stencil           (false)
{
    Lock lock(mutex);

    // Register the context destruction callback
    registerContextDestroyCallback(contextDestroyCallback, 0);

    // Insert the new frame buffer mapping into the set of all active mappings
    frameBuffers.insert(&m_frameBuffers);
    frameBuffers.insert(&m_multisampleFrameBuffers);
}